

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unordered_map.cpp
# Opt level: O0

bool operator==(string self,case_insensitive other)

{
  bool bVar1;
  chr_t *pcVar2;
  chr_t *pcVar3;
  undefined2 local_1b;
  char local_19;
  undefined1 auStack_18 [5];
  case_insensitive other_local;
  string self_local;
  
  _auStack_18 = self.data_;
  local_19 = other.data[2];
  local_1b = other.data._0_2_;
  pcVar2 = frozen::basic_string<char>::begin((basic_string<char> *)auStack_18);
  pcVar3 = frozen::basic_string<char>::end((basic_string<char> *)auStack_18);
  bVar1 = std::operator==(pcVar2,pcVar3,&local_1b,auStack_18);
  return bVar1;
}

Assistant:

bool operator==(frozen::string self, case_insensitive other) {
    return std::equal(self.begin(), self.end(), other.data, other.data + 3,
        [](char s, char o) { return std::tolower(s) == std::tolower(o);});
  }